

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

void __thiscall antlr::TokenBuffer::fill(TokenBuffer *this,uint amount)

{
  size_t sVar1;
  int in_ESI;
  TokenRefCount<antlr::Token> *in_RDI;
  TokenRefCount<antlr::Token> *in_stack_ffffffffffffffb8;
  TokenBuffer *in_stack_ffffffffffffffc0;
  
  syncConsume(in_stack_ffffffffffffffc0);
  while( true ) {
    sVar1 = CircularQueue<antlr::TokenRefCount<antlr::Token>_>::entries
                      ((CircularQueue<antlr::TokenRefCount<antlr::Token>_> *)
                       in_stack_ffffffffffffffc0);
    if ((uint)(in_ESI + *(int *)((long)&in_RDI[2].ref + 4)) <= sVar1) break;
    in_stack_ffffffffffffffc0 = (TokenBuffer *)(in_RDI + 4);
    (*(code *)(in_RDI[1].ref)->ptr->_vptr_Token)();
    CircularQueue<antlr::TokenRefCount<antlr::Token>_>::append
              ((CircularQueue<antlr::TokenRefCount<antlr::Token>_> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    TokenRefCount<antlr::Token>::~TokenRefCount(in_RDI);
  }
  return;
}

Assistant:

void TokenBuffer::fill(unsigned int amount)
{
	syncConsume();
	// Fill the buffer sufficiently to hold needed tokens
	while (queue.entries() < (amount + markerOffset))
	{
		// Append the next token
		queue.append(input.nextToken());
	}
}